

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

DispatchBuilder * __thiscall kern::DispatchBuilder::format(DispatchBuilder *this,FnFormat *func)

{
  bool bVar1;
  void *__s;
  invalid_argument *this_00;
  function<void_(const_kern::Metadata_&,_const_char_*,_char_*)> *in_RDI;
  nullptr_t in_stack_ffffffffffffffb8;
  function<void_(const_kern::Metadata_&,_const_char_*,_char_*)> *in_stack_ffffffffffffffc0;
  function<void_(const_kern::Metadata_&,_const_char_*,_char_*)> *in_stack_ffffffffffffffe0;
  
  if (*(long *)&(in_RDI->super__Function_base)._M_functor == 0) {
    __s = (void *)__cxa_allocate_exception(8);
    memset(__s,0,8);
    BuilderReuseException::BuilderReuseException((BuilderReuseException *)in_stack_ffffffffffffffc0)
    ;
    __cxa_throw(__s,&BuilderReuseException::typeinfo,BuilderReuseException::~BuilderReuseException);
  }
  bVar1 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (!bVar1) {
    std::function<void_(const_kern::Metadata_&,_const_char_*,_char_*)>::operator=
              (in_stack_ffffffffffffffe0,in_RDI);
    (*(Dispatch **)&(in_RDI->super__Function_base)._M_functor)->is_def_format = false;
    return (DispatchBuilder *)in_RDI;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"function ptr argument is NULL");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

DispatchBuilder &DispatchBuilder::format(FnFormat func) {
        if(this->inner == nullptr)
            throw BuilderReuseException();

        if(func == nullptr)
            throw std::invalid_argument("function ptr argument is NULL");

        this->inner->format_func = func;
        this->inner->is_def_format = false;

        return *this;
    }